

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

Iterator * __thiscall leveldb::VersionSet::MakeInputIterator(VersionSet *this,Compaction *c)

{
  Iterator **children;
  pointer ppFVar1;
  Iterator *pIVar2;
  LevelFileNumIterator *this_00;
  pointer ppFVar3;
  int n;
  int iVar4;
  ulong uVar5;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *flist;
  long lVar6;
  long in_FS_OFFSET;
  uint local_68;
  ReadOptions local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.snapshot = (Snapshot *)0x0;
  local_48.verify_checksums = this->options_->paranoid_checks;
  local_48.fill_cache = false;
  if (c->level_ == 0) {
    local_68 = (int)((ulong)((long)c->inputs_[0].
                                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)c->inputs_[0].
                                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1;
    uVar5 = 0xffffffffffffffff;
    if (-1 < (int)local_68) {
      uVar5 = (ulong)local_68 * 8;
    }
  }
  else {
    local_68 = 2;
    uVar5 = 0x10;
  }
  children = (Iterator **)operator_new__(uVar5);
  n = 0;
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    ppFVar1 = c->inputs_[lVar6].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar3 = c->inputs_[lVar6].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    iVar4 = n;
    if (ppFVar1 != ppFVar3) {
      flist = c->inputs_ + lVar6;
      if (c->level_ + (int)lVar6 == 0) {
        for (uVar5 = 0; uVar5 < (ulong)((long)ppFVar3 - (long)ppFVar1 >> 3); uVar5 = uVar5 + 1) {
          pIVar2 = TableCache::NewIterator
                             (this->table_cache_,&local_48,ppFVar1[uVar5]->number,
                              ppFVar1[uVar5]->file_size,(Table **)0x0);
          children[(long)n + uVar5] = pIVar2;
          ppFVar1 = (flist->
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          ppFVar3 = (flist->
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        }
        iVar4 = n + (int)uVar5;
      }
      else {
        this_00 = (LevelFileNumIterator *)operator_new(0x58);
        Version::LevelFileNumIterator::LevelFileNumIterator(this_00,&this->icmp_,flist);
        pIVar2 = NewTwoLevelIterator((Iterator *)this_00,GetFileIterator,this->table_cache_,
                                     &local_48);
        iVar4 = n + 1;
        children[n] = pIVar2;
      }
    }
    n = iVar4;
  }
  if ((int)local_68 < n) {
    __assert_fail("num <= space",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x4d9,"Iterator *leveldb::VersionSet::MakeInputIterator(Compaction *)");
  }
  pIVar2 = NewMergingIterator(&(this->icmp_).super_Comparator,children,n);
  operator_delete__(children);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pIVar2;
}

Assistant:

Iterator* VersionSet::MakeInputIterator(Compaction* c) {
  ReadOptions options;
  options.verify_checksums = options_->paranoid_checks;
  options.fill_cache = false;

  // Level-0 files have to be merged together.  For other levels,
  // we will make a concatenating iterator per level.
  // TODO(opt): use concatenating iterator for level-0 if there is no overlap
  const int space = (c->level() == 0 ? c->inputs_[0].size() + 1 : 2);
  Iterator** list = new Iterator*[space];
  int num = 0;
  for (int which = 0; which < 2; which++) {
    if (!c->inputs_[which].empty()) {
      if (c->level() + which == 0) {
        const std::vector<FileMetaData*>& files = c->inputs_[which];
        for (size_t i = 0; i < files.size(); i++) {
          list[num++] = table_cache_->NewIterator(options, files[i]->number,
                                                  files[i]->file_size);
        }
      } else {
        // Create concatenating iterator for the files from this level
        list[num++] = NewTwoLevelIterator(
            new Version::LevelFileNumIterator(icmp_, &c->inputs_[which]),
            &GetFileIterator, table_cache_, options);
      }
    }
  }
  assert(num <= space);
  Iterator* result = NewMergingIterator(&icmp_, list, num);
  delete[] list;
  return result;
}